

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

MessageFederate * __thiscall
helics::MessageFederate::operator=(MessageFederate *this,MessageFederate *mFed)

{
  bool bVar1;
  LocalFederateId id;
  long *in_RSI;
  MessageFederate *in_RDI;
  Federate *unaff_retaddr;
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  *in_stack_ffffffffffffffd8;
  LocalFederateId local_14;
  long *local_10;
  MessageFederate *fed;
  
  local_10 = in_RSI;
  fed = in_RDI;
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  operator=((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
             *)in_RDI,in_stack_ffffffffffffffd8);
  local_14 = Federate::getID((Federate *)
                             ((long)&in_RDI->_vptr_MessageFederate +
                             (long)in_RDI->_vptr_MessageFederate[-3]));
  id = Federate::getID((Federate *)((long)local_10 + *(long *)(*local_10 + -0x18)));
  bVar1 = LocalFederateId::operator!=(&local_14,id);
  if (bVar1) {
    Federate::operator=(unaff_retaddr,(Federate *)fed);
  }
  return in_RDI;
}

Assistant:

MessageFederate& MessageFederate::operator=(MessageFederate&& mFed) noexcept
{
    mfManager = std::move(mFed.mfManager);
    if (getID() != mFed.getID()) {  // the id won't be moved, as it is copied so use it as a test if
                                    // it has moved already
        Federate::operator=(std::move(mFed));
    }
    return *this;
}